

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O3

bool __thiscall cmServerBase::Serve(cmServerBase *this,string *errorMessage)

{
  shared_mutex *rwlock;
  uv_loop_t *loop;
  pointer puVar1;
  int iVar2;
  uv_thread_t uVar3;
  unique_ptr<cmConnection,_std::default_delete<cmConnection>_> *connection;
  pointer puVar4;
  uv_thread_t blank_thread_t;
  uv_thread_t local_38;
  
  local_38 = 0;
  iVar2 = uv_thread_equal(&local_38,&this->ServeThreadId);
  if (iVar2 == 0) {
    __assert_fail("uv_thread_equal(&blank_thread_t, &ServeThreadId)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmServer.cxx"
                  ,0x1bb,"virtual bool cmServerBase::Serve(std::string *)");
  }
  uVar3 = uv_thread_self();
  this->ServeThreadId = uVar3;
  errorMessage->_M_string_length = 0;
  *(errorMessage->_M_dataplus)._M_p = '\0';
  loop = &this->Loop;
  ::cm::uv_async_ptr::init(&this->ShutdownSignal,(EVP_PKEY_CTX *)loop);
  ::cm::uv_signal_ptr::init(&this->SIGINTHandler,(EVP_PKEY_CTX *)loop);
  ::cm::uv_signal_ptr::init(&this->SIGHUPHandler,(EVP_PKEY_CTX *)loop);
  ::cm::uv_signal_ptr::start(&this->SIGINTHandler,on_signal,2);
  ::cm::uv_signal_ptr::start(&this->SIGHUPHandler,on_signal,1);
  (*this->_vptr_cmServerBase[7])(this);
  rwlock = &this->ConnectionsMutex;
  uv_rwlock_rdlock(&rwlock->_M_);
  puVar4 = (this->Connections).
           super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->Connections).
           super__Vector_base<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>,_std::allocator<std::unique_ptr<cmConnection,_std::default_delete<cmConnection>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (puVar4 == puVar1) {
      uv_rwlock_rdunlock(&rwlock->_M_);
      iVar2 = uv_run(loop,UV_RUN_DEFAULT);
      if (iVar2 == 0) {
        return true;
      }
      __assert_fail("false && \"Event loop stopped in unclean state.\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmServer.cxx"
                    ,0x1d8,"virtual bool cmServerBase::Serve(std::string *)");
    }
    iVar2 = (*((puVar4->_M_t).
               super___uniq_ptr_impl<cmConnection,_std::default_delete<cmConnection>_>._M_t.
               super__Tuple_impl<0UL,_cmConnection_*,_std::default_delete<cmConnection>_>.
               super__Head_base<0UL,_cmConnection_*,_false>._M_head_impl)->_vptr_cmConnection[7])();
    if ((char)iVar2 == '\0') break;
    puVar4 = puVar4 + 1;
  }
  uv_rwlock_rdunlock(&rwlock->_M_);
  return false;
}

Assistant:

bool cmServerBase::Serve(std::string* errorMessage)
{
#ifndef NDEBUG
  uv_thread_t blank_thread_t = {};
  assert(uv_thread_equal(&blank_thread_t, &ServeThreadId));
  ServeThreadId = uv_thread_self();
#endif

  errorMessage->clear();

  ShutdownSignal.init(Loop, __shutdownThread, this);

  SIGINTHandler.init(Loop, this);
  SIGHUPHandler.init(Loop, this);

  SIGINTHandler.start(&on_signal, SIGINT);
  SIGHUPHandler.start(&on_signal, SIGHUP);

  OnServeStart();

  {
    cm::shared_lock<cm::shared_mutex> lock(ConnectionsMutex);
    for (auto& connection : Connections) {
      if (!connection->OnServeStart(errorMessage)) {
        return false;
      }
    }
  }

  if (uv_run(&Loop, UV_RUN_DEFAULT) != 0) {
    // It is important we don't ever let the event loop exit with open handles
    // at best this is a memory leak, but it can also introduce race conditions
    // which can hang the program.
    assert(false && "Event loop stopped in unclean state.");

    *errorMessage = "Internal Error: Event loop stopped in unclean state.";
    return false;
  }

  return true;
}